

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int32 smooth_mixw(float32 ****out_mixw,float32 ***mixw_acc_a,float32 ***mixw_acc_b,uint32 n_mixw,
                 uint32 n_feat,uint32 n_gau,model_def_t *mdef)

{
  float fVar1;
  uint32 n_ci_state_00;
  acmod_set_t *acmod_set_00;
  model_def_entry_t *pmVar2;
  uint32 *puVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  acmod_id_t aVar7;
  uint uVar8;
  uint uVar9;
  cmd_ln_t *pcVar10;
  float64 *dnom_00;
  float64 *dnom_01;
  float64 *dnom_02;
  uint32 **ci_mixw_00;
  uint32 **n_tied_00;
  float32 **lambda_00;
  float64 **lambda_acc_00;
  long lVar11;
  uchar *converged_00;
  char *pcVar12;
  bool bVar13;
  float cilambda_00;
  double dVar14;
  undefined8 in_stack_fffffffffffffe88;
  float32 ***pppfVar15;
  double local_148;
  undefined4 local_138;
  double local_128;
  acmod_set_t *acmod_set;
  uint32 **n_tied;
  uint32 n_conv_state;
  float32 cilambda;
  model_def_entry_t *defn;
  double dStack_f0;
  float32 prior_lambda;
  float64 norm;
  uint32 iter;
  acmod_id_t base;
  uint32 state_converged;
  uint32 converged;
  uchar *conv_flag;
  uint32 tt;
  uint32 max_iter;
  uint32 *ci_state;
  uint32 **ci_mixw;
  float64 **lambda_acc;
  float32 **lambda;
  float64 sum;
  float64 sum_b;
  float64 sum_a;
  float64 *dnom;
  float64 *dnom_b;
  float64 *dnom_a;
  uint32 max_state_pm;
  uint32 n_state;
  uint32 n_cd_state;
  uint32 n_ci_state;
  uint32 n_phone;
  uint32 cd_start;
  uint32 n_base;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 n_gau_local;
  uint32 n_feat_local;
  uint32 n_mixw_local;
  float32 ***mixw_acc_b_local;
  float32 ***mixw_acc_a_local;
  float32 ****out_mixw_local;
  
  pcVar10 = cmd_ln_get();
  dVar14 = cmd_ln_float_r(pcVar10,"-cilambda");
  cilambda_00 = (float)dVar14;
  acmod_set_00 = mdef->acmod_set;
  uVar5 = mdef->n_tied_state;
  dnom_00 = (float64 *)
            __ckd_calloc__((ulong)uVar5,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                           ,0xca);
  dnom_01 = (float64 *)
            __ckd_calloc__((ulong)uVar5,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                           ,0xcb);
  dnom_02 = (float64 *)
            __ckd_calloc__((ulong)uVar5,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                           ,0xcc);
  for (k = 0; k < uVar5; k = k + 1) {
    sum = 0.0;
    sum_b = 0.0;
    for (cd_start = 0; cd_start < n_gau; cd_start = cd_start + 1) {
      sum_b = (float64)((double)(float)(*mixw_acc_a[k])[cd_start] + (double)sum_b);
      sum = (float64)((double)(float)(*mixw_acc_b[k])[cd_start] + (double)sum);
    }
    if (((double)sum_b <= 0.0) || ((double)sum <= 0.0)) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
              ,0xdc,"Tied state %u never observed in the training corpus\n",(ulong)k);
      dnom_02[k] = 0.0;
      dnom_01[k] = 0.0;
      dnom_00[k] = 0.0;
    }
    else {
      dnom_00[k] = (float64)(1.0 / (double)sum_b);
      dnom_01[k] = (float64)(1.0 / (double)sum);
      dnom_02[k] = (float64)(1.0 / ((double)sum_b + (double)sum));
    }
  }
  uVar5 = mdef->n_tied_state - mdef->n_tied_ci_state;
  n_ci_state_00 = mdef->n_tied_ci_state;
  if (uVar5 == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
            ,0xe9,"Only CI states.\n");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
            ,0xea,"    CI PDF == %.2f * CI + %.2f * UNIFORM\n",(double)cilambda_00,
            SUB84(1.0 - (double)cilambda_00,0));
    accum_3d(mixw_acc_a,mixw_acc_b,n_ci_state_00,n_feat,n_gau);
    interp_counts_3d_uniform(mixw_acc_a,0,n_ci_state_00,n_feat,n_gau,(float32)cilambda_00);
    *out_mixw = mixw_acc_a;
    ckd_free_3d(mixw_acc_b);
  }
  else {
    uVar9 = mdef->max_n_state;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
            ,0x105,"Interpolating %u CD states\n",(ulong)uVar5);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
            ,0x106,"%u states max/model\n",(ulong)uVar9);
    ci_mixw_00 = (uint32 **)
                 __ckd_calloc_2d__((ulong)uVar5,(ulong)(uVar9 + 1),4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                                   ,0x109);
    for (k = 0; k < uVar5; k = k + 1) {
      for (n_base = 0; n_base < uVar9 + 1; n_base = n_base + 1) {
        ci_mixw_00[k][n_base] = 0xffffffff;
      }
    }
    n_tied_00 = (uint32 **)
                __ckd_calloc_2d__((ulong)uVar5,(ulong)(uVar9 + 1),4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                                  ,0x10f);
    for (k = 0; k < uVar5; k = k + 1) {
      for (n_base = 0; n_base < uVar9 + 1; n_base = n_base + 1) {
        n_tied_00[k][n_base] = 0xffffffff;
      }
    }
    k = acmod_set_n_ci(acmod_set_00);
    uVar6 = acmod_set_n_acmod(acmod_set_00);
    pmVar2 = mdef->defn;
    for (; k < uVar6; k = k + 1) {
      aVar7 = acmod_set_base_phone(acmod_set_00,k);
      for (n_base = 0; n_base < pmVar2[k].n_state; n_base = n_base + 1) {
        if ((n_ci_state_00 <= pmVar2[k].state[n_base]) && (pmVar2[k].state[n_base] != 0xffffffff)) {
          uVar8 = pmVar2[k].state[n_base] - n_ci_state_00;
          puVar3 = ci_mixw_00[uVar8];
          cd_start = 0;
          while( true ) {
            bVar13 = false;
            if (cd_start < uVar9) {
              bVar13 = puVar3[cd_start] != 0xffffffff;
            }
            if ((!bVar13) || (puVar3[cd_start] == pmVar2[aVar7].state[n_base])) break;
            cd_start = cd_start + 1;
          }
          if (puVar3[cd_start] != pmVar2[aVar7].state[n_base]) {
            puVar3[cd_start] = pmVar2[aVar7].state[n_base];
            n_tied_00[uVar8][cd_start] = 0;
          }
          n_tied_00[uVar8][cd_start] = n_tied_00[uVar8][cd_start] + 1;
        }
      }
    }
    lambda_00 = (float32 **)
                __ckd_calloc_2d__((ulong)uVar5,3,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                                  ,0x139);
    lambda_acc_00 =
         (float64 **)
         __ckd_calloc_2d__((ulong)uVar5,3,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                           ,0x13c);
    for (k = 0; k < uVar5; k = k + 1) {
      lambda_00[k][2] = 0.6;
      lambda_00[k][1] = 0.3;
      *lambda_00[k] = 0.1;
    }
    pcVar10 = cmd_ln_get();
    lVar11 = cmd_ln_int_r(pcVar10,"-maxiter");
    converged_00 = (uchar *)__ckd_calloc__((ulong)uVar5,1,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                                           ,0x148);
    bVar13 = false;
    n_tied._0_4_ = 0;
    for (norm._0_4_ = 0; norm._0_4_ < (uint)lVar11 && !bVar13; norm._0_4_ = norm._0_4_ + 1) {
      compute_mixw_lambda(lambda_00,lambda_acc_00,converged_00,uVar5,n_ci_state_00,ci_mixw_00,
                          mixw_acc_b,mixw_acc_a,dnom_00,n_mixw,n_feat,n_gau);
      pppfVar15 = mixw_acc_a;
      compute_mixw_lambda(lambda_00,lambda_acc_00,converged_00,uVar5,n_ci_state_00,ci_mixw_00,
                          mixw_acc_a,mixw_acc_b,dnom_01,n_mixw,n_feat,n_gau);
      for (k = 0; k < uVar5; k = k + 1) {
        if (converged_00[k] != '\x01') {
          dStack_f0 = 0.0;
          for (n_base = 0; n_base < 3; n_base = n_base + 1) {
            dStack_f0 = (double)lambda_acc_00[k][n_base] + dStack_f0;
          }
          if (dStack_f0 <= 1.199999978106707e-38) {
            for (n_base = 0; n_base < 3; n_base = n_base + 1) {
              lambda_00[k][n_base] = 0.33333334;
            }
            bVar4 = true;
          }
          else {
            bVar4 = true;
            for (n_base = 0; n_base < 3; n_base = n_base + 1) {
              fVar1 = (float)lambda_00[k][n_base];
              lambda_00[k][n_base] =
                   (float32)(float)((double)lambda_acc_00[k][n_base] * (1.0 / dStack_f0));
              lambda_acc_00[k][n_base] = 0.0;
              if (0.0001 < (double)((ulong)(double)(fVar1 - (float)lambda_00[k][n_base]) &
                                   (ulong)DAT_001211e0)) {
                bVar4 = false;
              }
            }
          }
          if (bVar4) {
            converged_00[k] = '\x01';
            n_tied._0_4_ = (uint)n_tied + 1;
            if ((uint)n_tied == uVar5) {
              bVar13 = true;
            }
          }
        }
      }
      in_stack_fffffffffffffe88 = CONCAT44((int)((ulong)pppfVar15 >> 0x20),uVar5);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
              ,0x188,"%u:%u:%u\n",(ulong)norm._0_4_,(ulong)(uint)n_tied,in_stack_fffffffffffffe88);
    }
    if (!bVar13) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
              ,0x18d,"%u of %u states converged after %u iterations.\n",(ulong)(uint)n_tied,
              (ulong)uVar5,CONCAT44((int)((ulong)in_stack_fffffffffffffe88 >> 0x20),norm._0_4_));
    }
    printf("SUMMARY\n\n");
    printf(" State  Count A   Count B    Total    CD    CI    UNI   Cnv\n");
    printf("------ --------- --------- --------- ----- ----- ------ ---\n");
    for (k = 0; k < uVar5; k = k + 1) {
      uVar9 = n_ci_state_00 + k;
      if ((double)dnom_00[uVar9] <= 0.0) {
        local_128 = 0.0;
      }
      else {
        local_128 = 1.0 / (double)dnom_00[uVar9];
      }
      if ((double)dnom_01[uVar9] <= 0.0) {
        local_138 = 0;
      }
      else {
        local_138 = SUB84(1.0 / (double)dnom_01[uVar9],0);
      }
      if ((double)dnom_02[uVar9] <= 0.0) {
        local_148 = 0.0;
      }
      else {
        local_148 = 1.0 / (double)dnom_02[uVar9];
      }
      pcVar12 = "n";
      if (converged_00[k] != '\0') {
        pcVar12 = "y";
      }
      printf("%6u %.3e %.3e %.3e %.3f %.3f %.3f %s\n",local_128,local_138,local_148,
             (double)(float)lambda_00[k][2],(double)(float)lambda_00[k][1],
             (double)(float)*lambda_00[k],(ulong)uVar9,pcVar12);
    }
    interp_mixw(out_mixw,mixw_acc_a,mixw_acc_b,dnom_02,lambda_00,(float32)cilambda_00,ci_mixw_00,
                n_tied_00,uVar5,n_ci_state_00,n_mixw,n_feat,n_gau);
  }
  return 0;
}

Assistant:

int32
smooth_mixw(float32 ****out_mixw,
	    
	    float32 ***mixw_acc_a,
	    float32 ***mixw_acc_b,

	    uint32 n_mixw,
	    uint32 n_feat,
	    uint32 n_gau,

	    model_def_t *mdef
	    )
{
    uint32 i, j, k;
    uint32 n_base, cd_start, n_phone;
    uint32 n_ci_state;
    uint32 n_cd_state;
    uint32 n_state;
    uint32 max_state_pm;
    float64 *dnom_a;
    float64 *dnom_b;
    float64 *dnom;
    float64 sum_a;
    float64 sum_b;
    float64 sum;
    float32 **lambda;
    float64 **lambda_acc;
    uint32 **ci_mixw;
    uint32 *ci_state;
    uint32 max_iter;
    uint32 tt;
    unsigned char *conv_flag;
    uint32 converged;
    uint32 state_converged;
    acmod_id_t base;
    uint32 iter;
    float64 norm;
    float32 prior_lambda;
    model_def_entry_t *defn;
    float32 cilambda = cmd_ln_float32("-cilambda");
    uint32 n_conv_state;
    uint32 **n_tied;
    acmod_set_t *acmod_set;

    acmod_set = mdef->acmod_set;

    /*
     * Compute normalization factors
     */
    n_state = mdef->n_tied_state;

    dnom_a = (float64 *)ckd_calloc(n_state, sizeof(float64));
    dnom_b = (float64 *)ckd_calloc(n_state, sizeof(float64));
    dnom   = (float64 *)ckd_calloc(n_state, sizeof(float64));

    /* compute the count normalization factor for all tied states */
    for (i = 0; i < n_state; i++) {
	sum_a = sum_b = sum = 0;
	for (k = 0; k < n_gau; k++) {
	    sum_a += mixw_acc_a[i][0][k];
	    sum_b += mixw_acc_b[i][0][k];
	}

	if ((sum_a > 0) && (sum_b > 0)) {
	    dnom_a[i] = 1.0 / sum_a;
	    dnom_b[i] = 1.0 / sum_b;
	    dnom[i] = 1.0 / (sum_a + sum_b);
	}
	else {
	    E_WARN("Tied state %u never observed in the training corpus\n", i);
	    dnom_a[i] = dnom_b[i] = dnom[i] = 0.0;
	}
    }

    /*
     * Interpolate CI states
     */

    n_cd_state = mdef->n_tied_state - mdef->n_tied_ci_state;
    n_ci_state = mdef->n_tied_ci_state;

    if (n_cd_state == 0) {
	E_INFO("Only CI states.\n");
	E_INFO("    CI PDF == %.2f * CI + %.2f * UNIFORM\n", cilambda, (1.0 - cilambda));
    
	/* add together counts for context independent states */
	accum_3d(mixw_acc_a, mixw_acc_b,
		 n_ci_state,	/* run over n_ci_state states */
		 n_feat, n_gau);

	/* interpolate CI distributions with uniform distribution */
	interp_counts_3d_uniform(mixw_acc_a,
				 0,		/* start state */
				 n_ci_state,	/* run length */
				 n_feat, n_gau,
				 cilambda);

	*out_mixw = mixw_acc_a;
	
	ckd_free_3d((void ***)mixw_acc_b);
	
	return S3_SUCCESS;
    }

    /*
     * Interpolate all states
     */

    max_state_pm = mdef->max_n_state;

    E_INFO("Interpolating %u CD states\n", n_cd_state);
    E_INFO("%u states max/model\n", max_state_pm);
    
    ci_mixw = (uint32 **)ckd_calloc_2d(n_cd_state, max_state_pm+1,
				       sizeof(uint32));
    for (i = 0; i < n_cd_state; i++)
	for (j = 0; j < max_state_pm+1; j++)
	    ci_mixw[i][j] = TYING_NO_ID;

    n_tied = (uint32 **)ckd_calloc_2d(n_cd_state, max_state_pm+1,
				      sizeof(uint32));
    for (i = 0; i < n_cd_state; i++)
	for (j = 0; j < max_state_pm+1; j++)
	    n_tied[i][j] = TYING_NO_ID;
    
    cd_start = n_base = acmod_set_n_ci(acmod_set);
    n_phone = acmod_set_n_acmod(acmod_set);

    defn = mdef->defn;
    
    /* for each cd state, find the id's of the associated ci states */
    for (i = cd_start; i < n_phone; i++) {
	base = acmod_set_base_phone(acmod_set, i);
	for (j = 0; j < defn[i].n_state; j++) {
	    if (defn[i].state[j] < n_ci_state) {
		/* This is a ci state, so skip it */

		continue;
	    }

	    if (defn[i].state[j] != TYING_NON_EMITTING) {
		tt = defn[i].state[j] - n_ci_state;

		ci_state = ci_mixw[tt];
		
		for (k = 0; (k < max_state_pm) && (ci_state[k] != TYING_NO_ID); k++) {
		    if (ci_state[k] == defn[base].state[j])
			break;	/* already on list */
		}

		if (ci_state[k] != defn[base].state[j]) {
		    /* not on list, so add */
		    ci_state[k] = defn[base].state[j];
		    n_tied[tt][k] = 0;
		}

		++n_tied[tt][k];	/* # of times CD and CI occur in same state position */
	    }
	}
    }
    
    lambda = (float32 **)ckd_calloc_2d(n_cd_state, N_DIST_TYPE,
					sizeof(float32));
    /* storage is returned zeroed */
    lambda_acc = (float64 **)ckd_calloc_2d(n_cd_state, N_DIST_TYPE,
					   sizeof(float64));

    for (i = 0; i < n_cd_state; i++) {
	/* biased initialization should help generally well trained models
	 * converge faster */
	lambda[i][(int)DIST_CD] = 0.6f;
	lambda[i][(int)DIST_CI] = 0.3f;
	lambda[i][(int)DIST_UNIFORM] = 0.1f;
    }

    max_iter = cmd_ln_int32("-maxiter");

    conv_flag = (unsigned char *)ckd_calloc(n_cd_state, sizeof(unsigned char));

    for (iter = 0, converged = FALSE, n_conv_state = 0;
	 (iter < max_iter) && (!converged);
	 iter++) {

	compute_mixw_lambda(lambda, lambda_acc, conv_flag,
			    n_cd_state, n_ci_state,
			    ci_mixw,
			    mixw_acc_b,
			    mixw_acc_a,
			    dnom_a,
			    n_mixw, n_feat, n_gau);

	compute_mixw_lambda(lambda, lambda_acc, conv_flag,
			    n_cd_state, n_ci_state,
			    ci_mixw,
			    mixw_acc_a,
			    mixw_acc_b,
			    dnom_b,
			    n_mixw, n_feat, n_gau);

	/* update lambdas and check for convergence */
	for (i = 0; i < n_cd_state; i++) {

	    if (conv_flag[i] == TRUE)	/* don't update converged states */
		continue;

	    norm = 0.0;
	    for (j = 0; j < N_DIST_TYPE; j++) {
		norm += lambda_acc[i][j];
	    }

	    if (norm > MIN_IEEE_NORM_POS_FLOAT32) {
		norm = 1.0f / norm;

		for (j = 0, state_converged = TRUE; j < N_DIST_TYPE; j++) {
		    prior_lambda = lambda[i][j];
		    lambda[i][j] = lambda_acc[i][j] * norm;

		    lambda_acc[i][j] = 0.0;

		    if (fabs(prior_lambda - lambda[i][j]) > CON_TH) {
			state_converged = FALSE;
		    }
		}
		    
	    }
	    else {
		for (j = 0; j < N_DIST_TYPE; j++) {
		    lambda[i][j] = 1.0f / N_DIST_TYPE;
		}
		state_converged = TRUE;
	    }
		
	    if (state_converged) {
		conv_flag[i] = TRUE;
		++n_conv_state;
		if (n_conv_state == n_cd_state) {
		    converged = TRUE;
		}
	    }
	}

	E_INFO("%u:%u:%u\n", iter, n_conv_state, n_cd_state);
    }

    if (!converged) {
	E_WARN("%u of %u states converged after %u iterations.\n",
	       n_conv_state, n_cd_state, iter);

    }

    printf("SUMMARY\n\n");
    printf(" State  Count A   Count B    Total    CD    CI    UNI   Cnv\n");
    printf("------ --------- --------- --------- ----- ----- ------ ---\n");
    for (i = 0; i < n_cd_state; i++) {

	j = n_ci_state + i;	/* CD tied state id */

	printf("%6u %.3e %.3e %.3e %.3f %.3f %.3f %s\n",
	       j,
	       (dnom_a[j] > 0 ? 1.0 / dnom_a[j] : 0.0),	/* count of partition A tied state j */
	       (dnom_b[j] > 0 ? 1.0 / dnom_b[j] : 0.0),	/* count of partition B tied state j */
	       (dnom[j] > 0 ? 1.0 / dnom[j] : 0.0),	/* count of partition A+B tied state j */
	       lambda[i][DIST_CD],
	       lambda[i][DIST_CI],
	       lambda[i][DIST_UNIFORM],
	       (conv_flag[i] ? "y" : "n"));
    }
    
    interp_mixw(out_mixw,
		mixw_acc_a, mixw_acc_b, dnom,
		lambda, cilambda,
		ci_mixw, n_tied,
		n_cd_state, n_ci_state,
		n_mixw, n_feat, n_gau);

    return S3_SUCCESS;
}